

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello_world.cpp
# Opt level: O1

void __thiscall hello::devide(hello *this,boundary_type type,string *str,char *name)

{
  base_iterator begin;
  size_type sVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  ostream *poVar3;
  size_t sVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  ssegment_index ind;
  mapping<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  rule_type local_b0;
  undefined1 local_ac;
  segment_index_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  segment_index_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  if (name == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar4 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,name,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  begin._M_current = (str->_M_dataplus)._M_p;
  sVar1 = str->_M_string_length;
  cppcms::application::context();
  cppcms::http::context::locale();
  booster::locale::boundary::details::
  mapping<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::mapping(&local_d0,type,begin,(base_iterator)(begin._M_current + sVar1),(locale *)&local_a8);
  local_b0 = 0xffffffff;
  local_ac = 0;
  std::locale::~locale((locale *)&local_a8);
  local_a8.value_.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current = (char *)0x0;
  local_a8.value_.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .second._M_current = (char *)0x0;
  local_a8.current_.first = 0;
  local_a8.current_.second = 0;
  local_a8.map_._0_5_ = 0;
  local_a8.map_._5_3_ = 0;
  local_68.current_.first = 0;
  local_68.current_.second = 0;
  local_68.map_._0_5_ = SUB85(&local_d0,0);
  local_68.map_._5_3_ = (undefined3)((ulong)&local_d0 >> 0x28);
  local_68.mask_ = local_b0;
  local_68.full_select_ = (bool)local_ac;
  local_68.value_.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current = local_d0.begin_._M_current;
  local_68.value_.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .second._M_current = local_d0.begin_._M_current;
  local_68.value_.rule_ = 0;
  booster::locale::boundary::details::
  segment_index_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::increment(&local_68);
  local_a8.value_.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current =
       local_68.value_.
       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .first._M_current;
  local_a8.value_.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .second._M_current =
       local_68.value_.
       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .second._M_current;
  local_a8.value_.rule_ = local_68.value_.rule_;
  local_a8.current_.first = local_68.current_.first;
  local_a8.current_.second = local_68.current_.second;
  local_a8.map_._0_5_ = local_68.map_._0_5_;
  local_a8.map_._5_3_ = local_68.map_._5_3_;
  local_a8._48_5_ =
       SUB85(CONCAT17(local_68.full_select_,CONCAT43(local_68.mask_,local_68.map_._5_3_)) >> 0x18,0)
  ;
  while (((mapping<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)CONCAT35(local_a8.map_._5_3_,local_a8.map_._0_5_) != &local_d0 ||
         (local_a8.current_.second !=
          (long)((local_d0.index_.
                  super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)((local_d0.index_.
                  super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_start >> 4))) {
    cppcms::application::response();
    poVar3 = (ostream *)cppcms::http::response::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"|",1);
    _Var2._M_current =
         local_a8.value_.
         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .second._M_current;
    for (_Var5._M_current =
              local_a8.value_.
              super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .first._M_current; _Var5._M_current != _Var2._M_current;
        _Var5._M_current = _Var5._M_current + 1) {
      local_68.value_.
      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .first._M_current._0_1_ = *_Var5._M_current;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_68,1);
    }
    booster::locale::boundary::details::
    segment_index_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::increment(&local_a8);
  }
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"|<br>\n",6);
  if (local_d0.index_.
      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.index_.
               super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void devide(cppcms::locale::boundary::boundary_type type,std::string const &str,char const *name)
	{
		response().out()<<name<<":";
		using namespace cppcms::locale::boundary;
		ssegment_index ind(type,str.begin(),str.end(),context().locale());

		ssegment_index::iterator p;

		for(p=ind.begin();p!=ind.end();++p) {
			response().out()<<"|"<<*p;
		}
		response().out()<<"|<br>\n";
	}